

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O3

void __thiscall QtMWidgets::DateTimePicker::mousePressEvent(DateTimePicker *this,QMouseEvent *event)

{
  int iVar1;
  DateTimePickerPrivate *pDVar2;
  long lVar3;
  QMouseEvent QVar4;
  int iVar5;
  QPoint QVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  if (*(int *)(event + 0x40) == 1) {
    ((this->d).d)->scrolling = false;
    auVar12 = QEventPoint::position();
    QVar6.xp = (int)((double)((ulong)auVar12._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                    auVar12._0_8_);
    QVar6.yp = (int)((double)((ulong)auVar12._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                    auVar12._8_8_);
    ((this->d).d)->mousePos = QVar6;
    pDVar2 = (this->d).d;
    pDVar2->leftMouseButtonPressed = true;
    dVar11 = (double)QEventPoint::position();
    lVar3 = (pDVar2->super_DateTimeParser).sections.d.size;
    iVar5 = -1;
    if (0 < lVar3) {
      iVar7 = (int)((double)((ulong)dVar11 & 0x8000000000000000 | (ulong)DAT_00181940) + dVar11);
      piVar8 = &((pDVar2->super_DateTimeParser).sections.d.ptr)->sectionWidth;
      lVar9 = 0;
      iVar10 = 0;
      do {
        iVar1 = *piVar8;
        if ((iVar10 <= iVar7) && (iVar7 < iVar1 + iVar10)) {
          iVar5 = (int)lVar9;
          break;
        }
        lVar9 = lVar9 + 1;
        piVar8 = piVar8 + 0xc;
        iVar10 = iVar1 + iVar10;
      } while (lVar3 != lVar9);
    }
    pDVar2->movableSection = iVar5;
    QVar4 = (QMouseEvent)0x1;
  }
  else {
    QVar4 = (QMouseEvent)0x0;
  }
  event[0xc] = QVar4;
  return;
}

Assistant:

void
DateTimePicker::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->scrolling = false;
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;
		d->findMovableSection( event->pos() );

		event->accept();
	}
	else
		event->ignore();
}